

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesWalk.h
# Opt level: O0

void __thiscall
dg::legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
          (NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *this,LLVMNode *n)

{
  AnalysesAuxiliaryData *pAVar1;
  LLVMNode *in_RSI;
  QueueFIFO<dg::LLVMNode_*> *in_RDI;
  AnalysesAuxiliaryData *aad;
  LLVMNode **in_stack_ffffffffffffffd8;
  
  pAVar1 = Analysis<dg::LLVMNode>::getAnalysisData
                     ((Analysis<dg::LLVMNode> *)
                      &(in_RDI->Container).c.
                       super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                       super__Deque_impl_data._M_map_size,in_RSI);
  if (pAVar1->lastwalkid !=
      *(uint *)&in_RDI[1].Container.c.
                super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_first) {
    pAVar1->lastwalkid =
         *(uint *)&in_RDI[1].Container.c.
                   super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first;
    ADT::QueueFIFO<dg::LLVMNode_*>::push(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void enqueue(NodeT *n) {
        AnalysesAuxiliaryData &aad = this->getAnalysisData(n);

        if (aad.lastwalkid == run_id)
            return;

        // mark node as visited
        aad.lastwalkid = run_id;
        queue.push(n);
    }